

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitAtomicNotify(BinaryInstWriter *this,AtomicNotify *curr)

{
  BufferWithRandomAccess *this_00;
  address64_t offset;
  AtomicNotify *curr_local;
  BinaryInstWriter *this_local;
  
  this_00 = BufferWithRandomAccess::operator<<(this->o,-2);
  BufferWithRandomAccess::operator<<(this_00,'\0');
  offset = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
  emitMemoryAccess(this,4,4,offset,(Name)(curr->memory).super_IString.str);
  return;
}

Assistant:

void BinaryInstWriter::visitAtomicNotify(AtomicNotify* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix) << int8_t(BinaryConsts::AtomicNotify);
  emitMemoryAccess(4, 4, curr->offset, curr->memory);
}